

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::MILSpec::TensorValue::_InternalSerialize
          (TensorValue *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  TensorValue_RepeatedFloats *this_00;
  TensorValue_RepeatedInts *this_01;
  TensorValue_RepeatedBools *this_02;
  TensorValue_RepeatedStrings *this_03;
  TensorValue_RepeatedLongInts *this_04;
  TensorValue_RepeatedDoubles *this_05;
  TensorValue_RepeatedBytes *this_06;
  void *data;
  uint32_t uVar2;
  ulong uVar3;
  int size;
  size_t __n;
  uint8_t *puVar4;
  
  uVar2 = this->_oneof_case_[0];
  if (uVar2 == 1) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_00 = (this->value_).floats_;
    *target = '\n';
    uVar1 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar4 = target + 2;
    }
    else {
      puVar4 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,target + 1);
    }
    target = TensorValue_RepeatedFloats::_InternalSerialize(this_00,puVar4,stream);
    uVar2 = this->_oneof_case_[0];
  }
  if (uVar2 == 2) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_01 = (this->value_).ints_;
    *target = '\x12';
    uVar1 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar4 = target + 2;
    }
    else {
      puVar4 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,target + 1);
    }
    target = TensorValue_RepeatedInts::_InternalSerialize(this_01,puVar4,stream);
    uVar2 = this->_oneof_case_[0];
  }
  if (uVar2 == 3) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_02 = (this->value_).bools_;
    *target = '\x1a';
    uVar1 = (this_02->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar4 = target + 2;
    }
    else {
      puVar4 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,target + 1);
    }
    target = TensorValue_RepeatedBools::_InternalSerialize(this_02,puVar4,stream);
    uVar2 = this->_oneof_case_[0];
  }
  if (uVar2 == 4) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_03 = (this->value_).strings_;
    *target = '\"';
    uVar1 = (this_03->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar4 = target + 2;
    }
    else {
      puVar4 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,target + 1);
    }
    target = TensorValue_RepeatedStrings::_InternalSerialize(this_03,puVar4,stream);
    uVar2 = this->_oneof_case_[0];
  }
  if (uVar2 == 5) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_04 = (this->value_).longints_;
    *target = '*';
    uVar1 = (this_04->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar4 = target + 2;
    }
    else {
      puVar4 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,target + 1);
    }
    target = TensorValue_RepeatedLongInts::_InternalSerialize(this_04,puVar4,stream);
    uVar2 = this->_oneof_case_[0];
  }
  if (uVar2 == 6) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_05 = (this->value_).doubles_;
    *target = '2';
    uVar1 = (this_05->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar4 = target + 2;
    }
    else {
      puVar4 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,target + 1);
    }
    target = TensorValue_RepeatedDoubles::_InternalSerialize(this_05,puVar4,stream);
    uVar2 = this->_oneof_case_[0];
  }
  if (uVar2 == 7) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_06 = (this->value_).bytes_;
    *target = ':';
    uVar1 = (this_06->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar1;
    if (uVar1 < 0x80) {
      puVar4 = target + 2;
    }
    else {
      puVar4 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar1,target + 1);
    }
    target = TensorValue_RepeatedBytes::_InternalSerialize(this_06,puVar4,stream);
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    uVar3 = uVar3 & 0xfffffffffffffffc;
    data = *(void **)(uVar3 + 8);
    size = (int)*(undefined8 *)(uVar3 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)target < (long)__n) {
      puVar4 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,target);
      return puVar4;
    }
    memcpy(target,data,__n);
    target = target + __n;
  }
  return target;
}

Assistant:

uint8_t* TensorValue::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.MILSpec.TensorValue)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.MILSpec.TensorValue.RepeatedFloats floats = 1;
  if (_internal_has_floats()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        1, _Internal::floats(this), target, stream);
  }

  // .CoreML.Specification.MILSpec.TensorValue.RepeatedInts ints = 2;
  if (_internal_has_ints()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        2, _Internal::ints(this), target, stream);
  }

  // .CoreML.Specification.MILSpec.TensorValue.RepeatedBools bools = 3;
  if (_internal_has_bools()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        3, _Internal::bools(this), target, stream);
  }

  // .CoreML.Specification.MILSpec.TensorValue.RepeatedStrings strings = 4;
  if (_internal_has_strings()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        4, _Internal::strings(this), target, stream);
  }

  // .CoreML.Specification.MILSpec.TensorValue.RepeatedLongInts longInts = 5;
  if (_internal_has_longints()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        5, _Internal::longints(this), target, stream);
  }

  // .CoreML.Specification.MILSpec.TensorValue.RepeatedDoubles doubles = 6;
  if (_internal_has_doubles()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        6, _Internal::doubles(this), target, stream);
  }

  // .CoreML.Specification.MILSpec.TensorValue.RepeatedBytes bytes = 7;
  if (_internal_has_bytes()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        7, _Internal::bytes(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.MILSpec.TensorValue)
  return target;
}